

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O0

void __thiscall
stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::
thread_remove_scheduling
          (MicrothreadManager<implementations::scheme::SchemeImplementation> *this,
          _threads_iterator thread)

{
  bool bVar1;
  reference __x;
  _Self local_30;
  _Base_ptr local_28;
  _Self local_20;
  iterator it;
  MicrothreadManager<implementations::scheme::SchemeImplementation> *this_local;
  _threads_iterator thread_local;
  
  local_28 = thread._M_node;
  it._M_node = (_Base_ptr)this;
  local_20._M_node = (_Base_ptr)getSchedulingFor(this,thread);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation,_std::less<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>,_std::allocator<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>_>
       ::end(&this->scheduling);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    __x = std::
          _Rb_tree_const_iterator<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>
          ::operator*(&local_20);
    std::
    set<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation,_std::less<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>,_std::allocator<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>_>
    ::erase(&this->scheduling,__x);
  }
  return;
}

Assistant:

void thread_remove_scheduling(_threads_iterator thread) {
				auto it = getSchedulingFor(thread);
				if (it != scheduling.end()) {
					scheduling.erase(*it);
				}
			}